

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmdblookup.c
# Opt level: O2

int benchmark(MMDB_s *mmdb,int iterations)

{
  FILE *__stream;
  int error_code;
  clock_t cVar1;
  char *pcVar2;
  int iVar3;
  bool bVar4;
  double dVar5;
  MMDB_entry_data_list_s *entry_data_list;
  int local_74;
  clock_t local_70;
  MMDB_lookup_result_s result;
  char ip_address [16];
  
  local_70 = clock();
  iVar3 = 0;
  if (0 < iterations) {
    iVar3 = iterations;
  }
  local_74 = iterations;
  do {
    bVar4 = iVar3 == 0;
    iVar3 = iVar3 + -1;
    if (bVar4) {
      cVar1 = clock();
      dVar5 = (double)(cVar1 - local_70) / 1000000.0;
      fprintf(_stdout,"\n  Looked up %i addresses in %.2f seconds. %.2f lookups per second.\n\n",
              dVar5,(double)local_74 / dVar5);
      iVar3 = 0;
LAB_00102f6e:
      MMDB_close(mmdb);
      return iVar3;
    }
    random_ipv4(ip_address);
    lookup_or_die(&result,mmdb,ip_address);
    entry_data_list = (MMDB_entry_data_list_s *)0x0;
    if ((result.found_entry == true) &&
       (error_code = MMDB_get_entry_data_list(&result.entry,&entry_data_list), __stream = _stderr,
       error_code != 0)) {
      pcVar2 = MMDB_strerror(error_code);
      fprintf(__stream,"Got an error looking up the entry data - %s\n",pcVar2);
      MMDB_free_entry_data_list(entry_data_list);
      iVar3 = 5;
      goto LAB_00102f6e;
    }
    MMDB_free_entry_data_list(entry_data_list);
  } while( true );
}

Assistant:

static int benchmark(MMDB_s *mmdb, int iterations) {
    char ip_address[16];
    int exit_code = 0;

    clock_t time = clock();

    for (int i = 0; i < iterations; i++) {
        random_ipv4(ip_address);

        MMDB_lookup_result_s result = lookup_or_die(mmdb, ip_address);
        MMDB_entry_data_list_s *entry_data_list = NULL;

        if (result.found_entry) {

            int status =
                MMDB_get_entry_data_list(&result.entry, &entry_data_list);

            if (MMDB_SUCCESS != status) {
                fprintf(stderr,
                        "Got an error looking up the entry data - %s\n",
                        MMDB_strerror(status));
                exit_code = 5;
                MMDB_free_entry_data_list(entry_data_list);
                goto end;
            }
        }

        MMDB_free_entry_data_list(entry_data_list);
    }

    time = clock() - time;
    double seconds = ((double)time / CLOCKS_PER_SEC);
    fprintf(stdout,
            "\n  Looked up %i addresses in %.2f seconds. %.2f lookups per "
            "second.\n\n",
            iterations,
            seconds,
            iterations / seconds);

end:
    MMDB_close(mmdb);

    return exit_code;
}